

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

void duckdb::BitwiseXOROperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  reference vector;
  reference vector_00;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  idx_t iVar14;
  ValidityMask *in_R9;
  data_ptr_t pdVar15;
  ulong uVar16;
  idx_t iVar17;
  ulong uVar18;
  bool bVar19;
  anon_struct_16_3_d7536bce_for_pointer aVar20;
  string_t sVar21;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  idx_t in_stack_ffffffffffffff08;
  idx_t local_d8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      aVar20 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                          ,in_R9,in_stack_ffffffffffffff08);
      paVar4->pointer = aVar20;
      return;
    }
  }
  else {
    local_d8 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar15 = vector->data;
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar12 = 8;
          while (bVar19 = local_d8 != 0, local_d8 = local_d8 - 1, bVar19) {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + lVar12);
            left_02.value._0_8_ = *(undefined8 *)(pdVar15 + lVar12 + -8);
            sVar21 = BinaryLambdaWrapper::
                     Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)paVar4->pointer,
                                in_R9,in_stack_ffffffffffffff08);
            *(long *)(pdVar5 + lVar12 + -8) = sVar21.value._0_8_;
            *(long *)(pdVar5 + lVar12) = sVar21.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
          return;
        }
        uVar9 = 0;
        uVar16 = 0;
        do {
          if (uVar9 == local_d8 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar16 + 0x40;
            if (local_d8 <= uVar16 + 0x40) {
              uVar13 = local_d8;
            }
LAB_01d4d86a:
            uVar10 = uVar16 << 4 | 8;
            for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
              left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar10);
              left.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar10 - 8));
              sVar21 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left,(string_t)paVar4->pointer,
                                  in_R9,uVar9);
              *(long *)(pdVar5 + (uVar10 - 8)) = sVar21.value._0_8_;
              *(long *)(pdVar5 + uVar10) = sVar21.value._8_8_;
              uVar10 = uVar10 + 0x10;
            }
          }
          else {
            uVar10 = puVar3[uVar9];
            uVar13 = uVar16 + 0x40;
            if (local_d8 <= uVar16 + 0x40) {
              uVar13 = local_d8;
            }
            if (uVar10 == 0xffffffffffffffff) goto LAB_01d4d86a;
            uVar8 = uVar13;
            if (uVar10 != 0) {
              uVar11 = uVar16 << 4 | 8;
              for (uVar18 = 0; uVar8 = uVar16 + uVar18, uVar16 + uVar18 < uVar13;
                  uVar18 = uVar18 + 1) {
                if ((uVar10 >> (uVar18 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar11);
                  left_00.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar11 - 8));
                  sVar21 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,
                                      (string_t)paVar4->pointer,in_R9,uVar9);
                  *(long *)(pdVar5 + (uVar11 - 8)) = sVar21.value._0_8_;
                  *(long *)(pdVar5 + uVar11) = sVar21.value._8_8_;
                }
                uVar11 = uVar11 + 0x10;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar16 = uVar8;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar15 = vector->data;
          pdVar5 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,local_d8);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar12 = 8;
            while (bVar19 = local_d8 != 0, local_d8 = local_d8 - 1, bVar19) {
              sVar21.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + lVar12);
              sVar21.value._0_8_ = *(undefined8 *)(pdVar15 + lVar12 + -8);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + lVar12);
              right_06.value._0_8_ = *(undefined8 *)(pdVar5 + lVar12 + -8);
              sVar21 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar21,right_06,in_R9,
                                  in_stack_ffffffffffffff08);
              *(long *)(pdVar6 + lVar12 + -8) = sVar21.value._0_8_;
              *(long *)(pdVar6 + lVar12) = sVar21.value._8_8_;
              lVar12 = lVar12 + 0x10;
            }
          }
          else {
            uVar16 = 0;
            for (uVar9 = 0; uVar9 != local_d8 + 0x3f >> 6; uVar9 = uVar9 + 1) {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar13 = uVar16 + 0x40;
                if (local_d8 <= uVar16 + 0x40) {
                  uVar13 = local_d8;
                }
LAB_01d4dcf9:
                uVar10 = uVar16 << 4 | 8;
                for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar10);
                  left_03.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar10 - 8));
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar10);
                  right_02.value._0_8_ = *(undefined8 *)(pdVar5 + (uVar10 - 8));
                  sVar21 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,uVar9);
                  *(long *)(pdVar6 + (uVar10 - 8)) = sVar21.value._0_8_;
                  *(long *)(pdVar6 + uVar10) = sVar21.value._8_8_;
                  uVar10 = uVar10 + 0x10;
                }
              }
              else {
                uVar10 = puVar3[uVar9];
                uVar13 = uVar16 + 0x40;
                if (local_d8 <= uVar16 + 0x40) {
                  uVar13 = local_d8;
                }
                if (uVar10 == 0xffffffffffffffff) goto LAB_01d4dcf9;
                uVar8 = uVar13;
                if (uVar10 != 0) {
                  uVar18 = uVar16 << 4 | 8;
                  for (uVar11 = 0; uVar8 = uVar16 + uVar11, uVar16 + uVar11 < uVar13;
                      uVar11 = uVar11 + 1) {
                    if ((uVar10 >> (uVar11 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar18);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar18 - 8));
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar18);
                      right_03.value._0_8_ = *(undefined8 *)(pdVar5 + (uVar18 - 8));
                      sVar21 = BinaryLambdaWrapper::
                               Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                          uVar9);
                      *(long *)(pdVar6 + (uVar18 - 8)) = sVar21.value._0_8_;
                      *(long *)(pdVar6 + uVar18) = sVar21.value._8_8_;
                    }
                    uVar18 = uVar18 + 0x10;
                  }
                }
              }
              uVar16 = uVar8;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,local_d8,&ldata);
          Vector::ToUnifiedFormat(vector_00,local_d8,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar15 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar15 = pdVar15 + 8;
            for (iVar17 = 0; local_d8 != iVar17; iVar17 = iVar17 + 1) {
              iVar7 = iVar17;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar7 = (idx_t)(ldata.sel)->sel_vector[iVar17];
              }
              iVar14 = iVar17;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(local_c0.sel)->sel_vector[iVar17];
              }
              left_01.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar7 * 0x10 + 8);
              left_01.value._0_8_ = *(undefined8 *)(ldata.data + iVar7 * 0x10);
              right.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar14 * 0x10 + 8);
              right.value._0_8_ = *(undefined8 *)(local_c0.data + iVar14 * 0x10);
              sVar21 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                  in_stack_ffffffffffffff08);
              *(long *)(pdVar15 + -8) = sVar21.value._0_8_;
              *(long *)pdVar15 = sVar21.value._8_8_;
              pdVar15 = pdVar15 + 0x10;
            }
          }
          else {
            pdVar15 = pdVar15 + 8;
            for (iVar17 = 0; local_d8 != iVar17; iVar17 = iVar17 + 1) {
              iVar7 = iVar17;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar7 = (idx_t)(ldata.sel)->sel_vector[iVar17];
              }
              iVar14 = iVar17;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(local_c0.sel)->sel_vector[iVar17];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar7 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(ldata.data + iVar7 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_c0.data + iVar14 * 0x10 + 8);
                right_04.value._0_8_ = *(undefined8 *)(local_c0.data + iVar14 * 0x10);
                sVar21 = BinaryLambdaWrapper::
                         Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    in_stack_ffffffffffffff08);
                *(long *)(pdVar15 + -8) = sVar21.value._0_8_;
                *(long *)pdVar15 = sVar21.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar17);
              }
              pdVar15 = pdVar15 + 0x10;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar15 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar12 = 8;
          while (bVar19 = local_d8 != 0, local_d8 = local_d8 - 1, bVar19) {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + lVar12);
            right_05.value._0_8_ = *(undefined8 *)(pdVar15 + lVar12 + -8);
            sVar21 = BinaryLambdaWrapper::
                     Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,right_05,
                                in_R9,in_stack_ffffffffffffff08);
            *(long *)(pdVar5 + lVar12 + -8) = sVar21.value._0_8_;
            *(long *)(pdVar5 + lVar12) = sVar21.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
          return;
        }
        uVar9 = 0;
        uVar16 = 0;
        do {
          if (uVar9 == local_d8 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar16 + 0x40;
            if (local_d8 <= uVar16 + 0x40) {
              uVar13 = local_d8;
            }
LAB_01d4db1c:
            uVar10 = uVar16 << 4 | 8;
            for (; uVar8 = uVar16, uVar16 < uVar13; uVar16 = uVar16 + 1) {
              right_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar10);
              right_00.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar10 - 8));
              sVar21 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,right_00
                                  ,in_R9,uVar9);
              *(long *)(pdVar5 + (uVar10 - 8)) = sVar21.value._0_8_;
              *(long *)(pdVar5 + uVar10) = sVar21.value._8_8_;
              uVar10 = uVar10 + 0x10;
            }
          }
          else {
            uVar10 = puVar3[uVar9];
            uVar13 = uVar16 + 0x40;
            if (local_d8 <= uVar16 + 0x40) {
              uVar13 = local_d8;
            }
            if (uVar10 == 0xffffffffffffffff) goto LAB_01d4db1c;
            uVar8 = uVar13;
            if (uVar10 != 0) {
              uVar11 = uVar16 << 4 | 8;
              for (uVar18 = 0; uVar8 = uVar16 + uVar18, uVar16 + uVar18 < uVar13;
                  uVar18 = uVar18 + 1) {
                if ((uVar10 >> (uVar18 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar11);
                  right_01.value._0_8_ = *(undefined8 *)(pdVar15 + (uVar11 - 8));
                  sVar21 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                      right_01,in_R9,uVar9);
                  *(long *)(pdVar5 + (uVar11 - 8)) = sVar21.value._0_8_;
                  *(long *)(pdVar5 + uVar11) = sVar21.value._8_8_;
                }
                uVar11 = uVar11 + 0x10;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar16 = uVar8;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseXOROperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseXor(rhs, lhs, target);
		    return target;
	    });
}